

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYs<unsigned_long_long> *getter2,TransformerLinLog *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterXsYs<unsigned_long_long> *pGVar6;
  TransformerLinLog *pTVar7;
  double dVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar12 = iVar4;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  lVar13 = (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar13);
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar13);
  dVar8 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar4 = transformer->YAxis;
  pIVar5 = pIVar11->CurrentPlot;
  dVar3 = pIVar5->YAxis[iVar4].Range.Min;
  IVar9.y = (float)((((double)(float)(dVar8 / pIVar11->LogDenY[iVar4]) *
                      (pIVar5->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) *
                    pIVar11->My[iVar4] + (double)pIVar11->PixelRange[iVar4].Min.y);
  IVar9.x = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                    (pIVar5->XAxis).Range.Min) * pIVar11->Mx +
                   (double)pIVar11->PixelRange[iVar4].Min.x);
  this->P11 = IVar9;
  pIVar11 = GImPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  lVar13 = (long)((pGVar6->Offset % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  uVar1 = *(unsigned_long_long *)((long)pGVar6->Xs + lVar13);
  uVar2 = *(unsigned_long_long *)((long)pGVar6->Ys + lVar13);
  dVar8 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar4 = pTVar7->YAxis;
  pIVar5 = pIVar11->CurrentPlot;
  dVar3 = pIVar5->YAxis[iVar4].Range.Min;
  IVar10.y = (float)((((double)(float)(dVar8 / pIVar11->LogDenY[iVar4]) *
                       (pIVar5->YAxis[iVar4].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar11->My[iVar4] + (double)pIVar11->PixelRange[iVar4].Min.y);
  IVar10.x = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                     (pIVar5->XAxis).Range.Min) * pIVar11->Mx +
                    (double)pIVar11->PixelRange[iVar4].Min.x);
  this->P12 = IVar10;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }